

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::SectionStats::SectionStats
          (SectionStats *this,SectionInfo *_sectionInfo,Counts *_assertions,
          double _durationInSeconds,bool _missingAssertions)

{
  bool _missingAssertions_local;
  double _durationInSeconds_local;
  Counts *_assertions_local;
  SectionInfo *_sectionInfo_local;
  SectionStats *this_local;
  
  this->_vptr_SectionStats = (_func_int **)&PTR__SectionStats_00262910;
  SectionInfo::SectionInfo(&this->sectionInfo,_sectionInfo);
  (this->assertions).passed = _assertions->passed;
  (this->assertions).failed = _assertions->failed;
  (this->assertions).failedButOk = _assertions->failedButOk;
  this->durationInSeconds = _durationInSeconds;
  this->missingAssertions = _missingAssertions;
  return;
}

Assistant:

SectionStats(   SectionInfo const& _sectionInfo,
                        Counts const& _assertions,
                        double _durationInSeconds,
                        bool _missingAssertions )
        :   sectionInfo( _sectionInfo ),
            assertions( _assertions ),
            durationInSeconds( _durationInSeconds ),
            missingAssertions( _missingAssertions )
        {}